

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodePCRelScst12(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  ulong in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  int32_t imm;
  undefined4 local_24;
  
  local_24 = in_ESI;
  if ((in_ESI & 0x800) != 0) {
    local_24 = in_ESI | 0xfffff000;
  }
  MCOperand_CreateImm0(in_RDI,(in_RDX & 0xffffffffffffffe0) + (long)(int)(local_24 << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodePCRelScst12(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	int32_t imm;

	imm = Val;
	/* Sign extend 12 bit value */
	if(imm & (1 << (12 - 1)))
		imm |= ~((1 << 12) - 1);

	/* Address is relative to the address of the first instruction in the fetch packet */
	MCOperand_CreateImm0(Inst, (Address & ~31) + (imm * 4));

	return MCDisassembler_Success;
}